

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

string * safeGetline(string *__return_storage_ptr__,string *prompt)

{
  int iVar1;
  string local_48;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  do {
    _readline(&local_48,prompt);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    while (__return_storage_ptr__->_M_string_length != 0) {
      iVar1 = isspace((int)(__return_storage_ptr__->_M_dataplus)._M_p
                           [__return_storage_ptr__->_M_string_length - 1]);
      if (iVar1 == 0) break;
      std::__cxx11::string::pop_back();
    }
    if (__return_storage_ptr__->_M_string_length != 0) {
      return __return_storage_ptr__;
    }
  } while( true );
}

Assistant:

string safeGetline(const string &prompt = "")
{
    string s;
    while(s.empty())
    {
        s = _readline(prompt);
        while(s.size() && isspace(s.back()))
            s.pop_back();
    }
    return s;
}